

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

CURLcode mqtt_send(Curl_easy *data,char *buf,size_t len)

{
  MQTT *pMVar1;
  CURLcode CVar2;
  size_t in_RAX;
  char *pcVar3;
  size_t length;
  size_t n;
  size_t local_28;
  
  pMVar1 = (data->req).p.mqtt;
  local_28 = in_RAX;
  CVar2 = Curl_xfer_send(data,buf,len,false,&local_28);
  if (CVar2 == CURLE_OK) {
    Curl_debug(data,CURLINFO_HEADER_OUT,buf,local_28);
    length = len - local_28;
    if (length == 0) {
      pMVar1->sendleftovers = (char *)0x0;
      pMVar1->nsend = 0;
    }
    else {
      pcVar3 = (char *)Curl_memdup(buf + local_28,length);
      if (pcVar3 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pMVar1->sendleftovers = pcVar3;
      pMVar1->nsend = length;
    }
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode mqtt_send(struct Curl_easy *data,
                          char *buf, size_t len)
{
  CURLcode result = CURLE_OK;
  struct MQTT *mq = data->req.p.mqtt;
  size_t n;
  result = Curl_xfer_send(data, buf, len, FALSE, &n);
  if(result)
    return result;
  Curl_debug(data, CURLINFO_HEADER_OUT, buf, (size_t)n);
  if(len != n) {
    size_t nsend = len - n;
    char *sendleftovers = Curl_memdup(&buf[n], nsend);
    if(!sendleftovers)
      return CURLE_OUT_OF_MEMORY;
    mq->sendleftovers = sendleftovers;
    mq->nsend = nsend;
  }
  else {
    mq->sendleftovers = NULL;
    mq->nsend = 0;
  }
  return result;
}